

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# faces_kba.c
# Opt level: O2

void Faces_recv_faces_end
               (Faces *faces,StepScheduler *stepscheduler,Dimensions dims_b,int step,Env *env)

{
  Request_t *pRVar1;
  Bool_t BVar2;
  int dir_ind;
  long lVar3;
  int axis;
  int axis_00;
  Request_t *request;
  
  if (faces->is_face_comm_async != 0) {
    Env_proc_x_this(env);
    Env_proc_y_this(env);
    Dimensions_size_facexz(dims_b,4,faces->noctant_per_block);
    Dimensions_size_faceyz(dims_b,4,faces->noctant_per_block);
    for (lVar3 = 0; lVar3 < faces->noctant_per_block; lVar3 = lVar3 + 1) {
      for (axis_00 = 0; axis_00 != 2; axis_00 = axis_00 + 1) {
        pRVar1 = faces->request_recv_yz;
        if (axis_00 == 0) {
          pRVar1 = faces->request_recv_xz;
        }
        for (dir_ind = 0; dir_ind != 2; dir_ind = dir_ind + 1) {
          BVar2 = StepScheduler_must_do_recv(stepscheduler,step,axis_00,dir_ind,(int)lVar3,env);
          if (BVar2 != 0) {
            Env_wait(env,pRVar1 + lVar3);
          }
        }
      }
    }
    return;
  }
  __assert_fail("Faces_is_face_comm_async( faces )",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/faces_kba.c"
                ,0x1b3,"void Faces_recv_faces_end(Faces *, StepScheduler *, Dimensions, int, Env *)"
               );
}

Assistant:

void Faces_recv_faces_end(
  Faces*          faces,
  StepScheduler*  stepscheduler,
  Dimensions      dims_b,
  int             step,
  Env*            env )
{
  Assert( Faces_is_face_comm_async( faces ) );

  const int proc_x = Env_proc_x_this( env );
  const int proc_y = Env_proc_y_this( env );

  const size_t size_facexz_per_octant = Dimensions_size_facexz( dims_b,
                 NU, faces->noctant_per_block ) / faces->noctant_per_block;
  const size_t size_faceyz_per_octant = Dimensions_size_faceyz( dims_b,
                 NU, faces->noctant_per_block ) / faces->noctant_per_block;

  /*---Loop over octants---*/

  int octant_in_block = 0;

  for( octant_in_block=0; octant_in_block<faces->noctant_per_block;
                                                            ++octant_in_block )
  {
    /*---Communicate +/-X, +/-Y---*/

    int axis = 0;

    for( axis=0; axis<2; ++axis )
    {
      const Bool_t axis_x = axis==0;

      int dir_ind = 0;

      for( dir_ind=0; dir_ind<2; ++dir_ind )
      {
        /*---Determine whether to communicate---*/

        Bool_t const do_recv = StepScheduler_must_do_recv(
                   stepscheduler, step, axis, dir_ind, octant_in_block, env );

        if( do_recv )
        {
          Request_t* request = axis_x ?
                                   & faces->request_recv_xz[octant_in_block]
                                 : & faces->request_recv_yz[octant_in_block];
          Env_wait( env, request );
        }
      } /*---dir_ind---*/
    } /*---axis---*/
  } /*---octant_in_block---*/
}